

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void icu_63::loadCharNames(UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  
  uCharNamesData = udata_openChoice_63((char *)0x0,"icu","unames",isAcceptable,(void *)0x0,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    uCharNames = udata_getMemory_63(uCharNamesData);
  }
  else {
    uCharNamesData = (UDataMemory *)0x0;
  }
  ucln_common_registerCleanup_63(UCLN_COMMON_UNAMES,unames_cleanup);
  return;
}

Assistant:

static void U_CALLCONV
loadCharNames(UErrorCode &status) {
    U_ASSERT(uCharNamesData == NULL);
    U_ASSERT(uCharNames == NULL);

    uCharNamesData = udata_openChoice(NULL, DATA_TYPE, DATA_NAME, isAcceptable, NULL, &status);
    if(U_FAILURE(status)) {
        uCharNamesData = NULL;
    } else {
        uCharNames = (UCharNames *)udata_getMemory(uCharNamesData);
    }
    ucln_common_registerCleanup(UCLN_COMMON_UNAMES, unames_cleanup);
}